

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::(anonymous_namespace)::SSLVersionTest_ClientSessionCacheMode_Test::
~SSLVersionTest_ClientSessionCacheMode_Test(SSLVersionTest_ClientSessionCacheMode_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__SSLVersionTest_00429750;
  *(undefined ***)this = &PTR__SSLVersionTest_00429790;
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)(this + 0x38));
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(this + 0x30));
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)(this + 0x28));
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)(this + 0x20));
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)(this + 0x18));
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)(this + 0x10));
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x50);
  return;
}

Assistant:

TEST_P(SSLVersionTest, ClientSessionCacheMode) {
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_OFF);
  EXPECT_FALSE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_CLIENT);
  EXPECT_TRUE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_SERVER);
  EXPECT_FALSE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));
}